

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O0

bool __thiscall RTIMUBMX055::setAccelFSR(RTIMUBMX055 *this)

{
  bool bVar1;
  uchar local_19;
  uchar reg;
  RTIMUBMX055 *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_BMX055AccelFsr) {
  case 0:
    local_19 = '\x03';
    this->m_accelScale = 6.125e-05;
    break;
  case 1:
    local_19 = '\x05';
    this->m_accelScale = 0.000121875;
    break;
  case 2:
    local_19 = '\b';
    this->m_accelScale = 0.000244375;
    break;
  case 3:
    local_19 = '\f';
    this->m_accelScale = 0.000488125;
    break;
  default:
    fprintf(_stderr,"Illegal BMX055 accel FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_BMX055AccelFsr);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                             this->m_accelSlaveAddr,'\x0f',local_19,
                             "Failed to set BMX055 accel rate");
  return bVar1;
}

Assistant:

bool RTIMUBMX055::setAccelFSR()
{
    unsigned char reg;

    switch(m_settings->m_BMX055AccelFsr) {
    case BMX055_ACCEL_FSR_2:
        reg = 0x03;
        m_accelScale = 0.00098 / 16.0;
        break;

    case BMX055_ACCEL_FSR_4:
        reg = 0x05;
        m_accelScale = 0.00195 / 16.0;
        break;

    case BMX055_ACCEL_FSR_8:
        reg = 0x08;
        m_accelScale = 0.00391 / 16.0;
        break;

    case BMX055_ACCEL_FSR_16:
        reg = 0x0c;
        m_accelScale = 0.00781 / 16.0;
        break;

    default:
        HAL_ERROR1("Illegal BMX055 accel FSR code %d\n", m_settings->m_BMX055AccelFsr);
        return false;
    }
    return (m_settings->HALWrite(m_accelSlaveAddr, BMX055_ACCEL_PMU_RANGE, reg, "Failed to set BMX055 accel rate"));
}